

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
::_positive_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  uint uVar1;
  Dimension DVar2;
  uint uVar3;
  undefined4 uVar4;
  long lVar5;
  bool bVar6;
  ID_index IVar7;
  long lVar8;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
  *pIVar9;
  Column *col;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
  *pIVar10;
  ID_index IVar11;
  long lVar12;
  long lVar13;
  anon_class_1_0_00000001 local_47;
  anon_class_1_0_00000001 local_46;
  anon_class_1_0_00000001 local_45;
  Index local_44;
  anon_class_8_1_e4bd5e45 local_40;
  ulong local_38;
  
  lVar5 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
  lVar12 = (ulong)columnIndex1 * 0x40;
  lVar13 = (ulong)columnIndex2 * 0x40;
  pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
             *)(lVar13 + lVar5);
  local_44 = columnIndex2;
  if (*(int *)(lVar5 + 0x18 + lVar12) == -1) {
    local_40.targetColumn._0_4_ = columnIndex1;
    if ((this->birthComp_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_001d319f:
      local_40.targetColumn._0_4_ = columnIndex1;
      std::__throw_bad_function_call();
    }
    bVar6 = (*(this->birthComp_)._M_invoker)((_Any_data *)this,(uint *)&local_40,&local_44);
    lVar5 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
    if ((bVar6) && ((pIVar10->super_Chain_column_option).pairedColumn_ == 0xffffffff)) {
      pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                 *)(lVar5 + lVar13);
      IVar11 = *(ID_index *)(lVar5 + 0x14 + lVar13);
      pIVar9 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                *)(lVar12 + lVar5);
      local_40.targetColumn = pIVar10;
      bVar6 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                        (pIVar9,pIVar10,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                         &local_46,&local_47);
      if (bVar6) {
        IVar7 = (pIVar10->super_Chain_column_option).pivot_;
        (pIVar10->super_Chain_column_option).pivot_ = (pIVar9->super_Chain_column_option).pivot_;
        (pIVar9->super_Chain_column_option).pivot_ = IVar7;
        DVar2 = (pIVar10->super_Column_dimension_option).dim_;
        (pIVar10->super_Column_dimension_option).dim_ = (pIVar9->super_Column_dimension_option).dim_
        ;
        (pIVar9->super_Column_dimension_option).dim_ = DVar2;
      }
      IVar7 = (pIVar10->super_Chain_column_option).pivot_;
      local_38._0_4_ = columnIndex1;
      if (IVar11 == IVar7) {
        return columnIndex1;
      }
      goto LAB_001d3178;
    }
    IVar11 = *(ID_index *)(lVar5 + 0x14 + lVar12);
LAB_001d3120:
    pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
               *)(lVar5 + lVar12);
    pIVar9 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
              *)(lVar13 + lVar5);
    local_40.targetColumn = pIVar10;
    bVar6 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar9,pIVar10,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                       &local_46,&local_47);
    if (bVar6) {
      IVar7 = (pIVar10->super_Chain_column_option).pivot_;
      (pIVar10->super_Chain_column_option).pivot_ = (pIVar9->super_Chain_column_option).pivot_;
      (pIVar9->super_Chain_column_option).pivot_ = IVar7;
      DVar2 = (pIVar10->super_Column_dimension_option).dim_;
      (pIVar10->super_Column_dimension_option).dim_ = (pIVar9->super_Column_dimension_option).dim_;
      (pIVar9->super_Column_dimension_option).dim_ = DVar2;
    }
  }
  else {
    pIVar9 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
              *)(lVar5 + lVar12);
    if ((pIVar10->super_Chain_column_option).pairedColumn_ != 0xffffffff) {
      local_38 = CONCAT44(local_38._4_4_,columnIndex1);
      local_40.targetColumn._0_4_ = columnIndex1;
      if ((this->deathComp_).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_001d319f;
      bVar6 = (*(this->deathComp_)._M_invoker)
                        ((_Any_data *)&this->deathComp_,(uint *)&local_40,&local_44);
      lVar5 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
      if (bVar6) {
        lVar8 = (ulong)(pIVar10->super_Chain_column_option).pairedColumn_ * 0x40;
        pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                   *)(lVar5 + lVar8);
        uVar1 = *(uint *)(lVar5 + 0x14 + lVar8);
        pIVar9 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                  *)((ulong)(pIVar9->super_Chain_column_option).pairedColumn_ * 0x40 + lVar5);
        local_40.targetColumn = pIVar10;
        bVar6 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                          (pIVar9,pIVar10,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                           &local_46,&local_47);
        if (bVar6) {
          IVar11 = (pIVar10->super_Chain_column_option).pivot_;
          (pIVar10->super_Chain_column_option).pivot_ = (pIVar9->super_Chain_column_option).pivot_;
          (pIVar9->super_Chain_column_option).pivot_ = IVar11;
          DVar2 = (pIVar10->super_Column_dimension_option).dim_;
          (pIVar10->super_Column_dimension_option).dim_ =
               (pIVar9->super_Column_dimension_option).dim_;
          (pIVar9->super_Column_dimension_option).dim_ = DVar2;
        }
        uVar3 = (pIVar10->super_Chain_column_option).pivot_;
        if (uVar1 != uVar3) {
          lVar5 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
          uVar4 = *(undefined4 *)(lVar5 + (ulong)uVar1 * 4);
          *(undefined4 *)(lVar5 + (ulong)uVar1 * 4) = *(undefined4 *)(lVar5 + (ulong)uVar3 * 4);
          *(undefined4 *)(lVar5 + (ulong)uVar3 * 4) = uVar4;
        }
        lVar5 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
        pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                   *)(lVar5 + lVar13);
        IVar11 = *(ID_index *)(lVar5 + 0x14 + lVar13);
        pIVar9 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                  *)(lVar12 + lVar5);
        local_40.targetColumn = pIVar10;
        bVar6 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                          (pIVar9,pIVar10,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                           &local_46,&local_47);
        if (bVar6) {
          IVar7 = (pIVar10->super_Chain_column_option).pivot_;
          (pIVar10->super_Chain_column_option).pivot_ = (pIVar9->super_Chain_column_option).pivot_;
          (pIVar9->super_Chain_column_option).pivot_ = IVar7;
          DVar2 = (pIVar10->super_Column_dimension_option).dim_;
          (pIVar10->super_Column_dimension_option).dim_ =
               (pIVar9->super_Column_dimension_option).dim_;
          (pIVar9->super_Column_dimension_option).dim_ = DVar2;
        }
        IVar7 = (pIVar10->super_Chain_column_option).pivot_;
        if (IVar11 == IVar7) {
          return (Index)local_38;
        }
        goto LAB_001d3178;
      }
      lVar8 = (ulong)(pIVar9->super_Chain_column_option).pairedColumn_ * 0x40;
      pIVar9 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                *)(lVar5 + lVar8);
      local_38 = (ulong)*(uint *)(lVar5 + 0x14 + lVar8);
      pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_false,_true>_>_>
                 *)((ulong)(pIVar10->super_Chain_column_option).pairedColumn_ * 0x40 + lVar5);
      local_40.targetColumn = pIVar9;
      bVar6 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                        (pIVar10,pIVar9,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                         &local_46,&local_47);
      if (bVar6) {
        IVar11 = (pIVar9->super_Chain_column_option).pivot_;
        (pIVar9->super_Chain_column_option).pivot_ = (pIVar10->super_Chain_column_option).pivot_;
        (pIVar10->super_Chain_column_option).pivot_ = IVar11;
        DVar2 = (pIVar9->super_Column_dimension_option).dim_;
        (pIVar9->super_Column_dimension_option).dim_ = (pIVar10->super_Column_dimension_option).dim_
        ;
        (pIVar10->super_Column_dimension_option).dim_ = DVar2;
      }
      uVar1 = (pIVar9->super_Chain_column_option).pivot_;
      if ((uint)local_38 != uVar1) {
        lVar5 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
        uVar4 = *(undefined4 *)(lVar5 + local_38 * 4);
        *(undefined4 *)(lVar5 + local_38 * 4) = *(undefined4 *)(lVar5 + (ulong)uVar1 * 4);
        *(undefined4 *)(lVar5 + (ulong)uVar1 * 4) = uVar4;
      }
      lVar5 = *(long *)((long)&this[1].birthComp_.super__Function_base._M_functor + 8);
      IVar11 = *(ID_index *)(lVar5 + 0x14 + lVar12);
      goto LAB_001d3120;
    }
    IVar11 = (pIVar10->super_Chain_column_option).pivot_;
    local_40.targetColumn = pIVar10;
    bVar6 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,false,false,true,true,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar9,pIVar10,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                       &local_46,&local_47);
    columnIndex2 = columnIndex1;
    if (bVar6) {
      IVar7 = (pIVar10->super_Chain_column_option).pivot_;
      (pIVar10->super_Chain_column_option).pivot_ = (pIVar9->super_Chain_column_option).pivot_;
      (pIVar9->super_Chain_column_option).pivot_ = IVar7;
      DVar2 = (pIVar10->super_Column_dimension_option).dim_;
      (pIVar10->super_Column_dimension_option).dim_ = (pIVar9->super_Column_dimension_option).dim_;
      (pIVar9->super_Column_dimension_option).dim_ = DVar2;
    }
  }
  IVar7 = (pIVar10->super_Chain_column_option).pivot_;
  local_38._0_4_ = columnIndex2;
  if (IVar11 == IVar7) {
    return columnIndex2;
  }
LAB_001d3178:
  lVar5 = *(long *)&this[1].deathComp_.super__Function_base._M_functor;
  uVar4 = *(undefined4 *)(lVar5 + (ulong)IVar11 * 4);
  *(undefined4 *)(lVar5 + (ulong)IVar11 * 4) = *(undefined4 *)(lVar5 + (ulong)IVar7 * 4);
  *(undefined4 *)(lVar5 + (ulong)IVar7 * 4) = uVar4;
  return (Index)local_38;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_positive_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }
  // TODO: factorize the cases
  // But for debug it is much more easier to understand what is happening when split like this
  if (!col1.is_paired()) {  // F x *
    bool hasSmallerBirth;
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      // this order because position were swapped with CP::swap_positions
      hasSmallerBirth = (CP::birth(col2.get_pivot()) < CP::birth(col1.get_pivot()));
    } else {
      hasSmallerBirth = birthComp_(columnIndex1, columnIndex2);
    }

    if (!col2.is_paired() && hasSmallerBirth) {
      _matrix()->add_to(columnIndex1, columnIndex2);
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
      }
      return columnIndex1;
    }
    _matrix()->add_to(columnIndex2, columnIndex1);

    return columnIndex2;
  }

  if (!col2.is_paired()) {  // G x F
    static_cast<Master_chain_matrix*>(this)->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  bool hasSmallerDeath;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    // this order because position were swapped with CP::swap_positions
    hasSmallerDeath = (CP::death(col2.get_pivot()) < CP::death(col1.get_pivot()));
  } else {
    hasSmallerDeath = deathComp_(columnIndex1, columnIndex2);
  }

  // G x G
  if (hasSmallerDeath)
  {
    _matrix()->add_to(col1.get_paired_chain_index(), col2.get_paired_chain_index());
    _matrix()->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  _matrix()->add_to(col2.get_paired_chain_index(), col1.get_paired_chain_index());
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}